

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.cc
# Opt level: O0

bool SumFile(string *out_hex,EVP_MD *md,Source *source)

{
  FILE *__stream;
  undefined4 fd_00;
  bool bVar1;
  int iVar2;
  EVP_MD_CTX *pEVar3;
  pointer puVar4;
  int *piVar5;
  char *pcVar6;
  char *local_1a0;
  allocator local_171;
  string local_170 [35];
  byte local_14d;
  uint local_14c;
  char local_148 [3];
  uint8_t b;
  uint i;
  char hex_digest [128];
  uint local_bc;
  byte local_b8 [4];
  uint digest_len;
  uint8_t digest [64];
  size_t n;
  ScopedEVP_MD_CTX ctx;
  __array buf;
  undefined1 local_34 [12];
  int fd;
  ScopedFD scoped_fd;
  Source *source_local;
  EVP_MD *md_local;
  string *out_hex_local;
  
  _fd = source;
  ScopedFD::ScopedFD((ScopedFD *)(local_34 + 8));
  bVar1 = Source::is_stdin(_fd);
  if (bVar1) {
    local_34._4_4_ = 0;
  }
  else {
    Source::filename_abi_cxx11_(_fd);
    OpenFile((string *)local_34);
    ScopedFD::operator=((ScopedFD *)(local_34 + 8),(ScopedFD *)local_34);
    ScopedFD::~ScopedFD((ScopedFD *)local_34);
    bVar1 = ScopedFD::operator_cast_to_bool((ScopedFD *)(local_34 + 8));
    if (!bVar1) {
      out_hex_local._7_1_ = false;
      goto LAB_0012cb6c;
    }
    local_34._4_4_ = ScopedFD::get((ScopedFD *)(local_34 + 8));
  }
  std::make_unique<unsigned_char[]>((size_t)&ctx.ctx_.pctx_ops);
  bssl::internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)&n);
  pEVar3 = (EVP_MD_CTX *)
           bssl::internal::
           StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
           ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                  *)&n);
  iVar2 = EVP_DigestInit_ex(pEVar3,(EVP_MD *)md,(ENGINE *)0x0);
  if (iVar2 == 0) {
    fprintf(_stderr,"Failed to initialize EVP_MD_CTX.\n");
    out_hex_local._7_1_ = false;
  }
  else {
    do {
      fd_00 = local_34._4_4_;
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &ctx.ctx_.pctx_ops);
      bVar1 = ReadFromFD(fd_00,(size_t *)(digest + 0x38),puVar4,0x2000);
      __stream = _stderr;
      if (!bVar1) {
        bVar1 = Source::is_stdin(_fd);
        if (bVar1) {
          local_1a0 = "standard input";
        }
        else {
          Source::filename_abi_cxx11_(_fd);
          local_1a0 = (char *)std::__cxx11::string::c_str();
        }
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(__stream,"Failed to read from %s: %s\n",local_1a0,pcVar6);
        out_hex_local._7_1_ = false;
        goto LAB_0012cb44;
      }
      if (digest._56_8_ == 0) {
        pEVar3 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)&n);
        iVar2 = EVP_DigestFinal_ex(pEVar3,local_b8,&local_bc);
        if (iVar2 == 0) {
          fprintf(_stderr,"Failed to finish hash.\n");
          out_hex_local._7_1_ = false;
        }
        else {
          for (local_14c = 0; local_14c < local_bc; local_14c = local_14c + 1) {
            local_14d = local_b8[local_14c];
            local_148[local_14c << 1] = "0123456789abcdef"[(int)(uint)local_14d >> 4];
            local_148[local_14c * 2 + 1] = "0123456789abcdef"[(int)(local_14d & 0xf)];
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,local_148,(ulong)(local_bc * 2),&local_171);
          std::__cxx11::string::operator=((string *)out_hex,local_170);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          out_hex_local._7_1_ = true;
        }
        goto LAB_0012cb44;
      }
      pEVar3 = (EVP_MD_CTX *)
               bssl::internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)&n);
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &ctx.ctx_.pctx_ops);
      iVar2 = EVP_DigestUpdate(pEVar3,puVar4,digest._56_8_);
    } while (iVar2 != 0);
    fprintf(_stderr,"Failed to update hash.\n");
    out_hex_local._7_1_ = false;
  }
LAB_0012cb44:
  bssl::internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)&n);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             &ctx.ctx_.pctx_ops);
LAB_0012cb6c:
  ScopedFD::~ScopedFD((ScopedFD *)(local_34 + 8));
  return out_hex_local._7_1_;
}

Assistant:

static bool SumFile(std::string *out_hex, const EVP_MD *md,
                    const Source &source) {
  ScopedFD scoped_fd;
  int fd;

  if (source.is_stdin()) {
    fd = 0;
  } else {
    scoped_fd = OpenFile(source.filename());
    if (!scoped_fd) {
      return false;
    }
    fd = scoped_fd.get();
  }

  static const size_t kBufSize = 8192;
  auto buf = std::make_unique<uint8_t[]>(kBufSize);

  bssl::ScopedEVP_MD_CTX ctx;
  if (!EVP_DigestInit_ex(ctx.get(), md, NULL)) {
    fprintf(stderr, "Failed to initialize EVP_MD_CTX.\n");
    return false;
  }

  for (;;) {
    size_t n;
    if (!ReadFromFD(fd, &n, buf.get(), kBufSize)) {
      fprintf(stderr, "Failed to read from %s: %s\n",
              source.is_stdin() ? kStdinName : source.filename().c_str(),
              strerror(errno));
      return false;
    }

    if (n == 0) {
      break;
    }

    if (!EVP_DigestUpdate(ctx.get(), buf.get(), n)) {
      fprintf(stderr, "Failed to update hash.\n");
      return false;
    }
  }

  uint8_t digest[EVP_MAX_MD_SIZE];
  unsigned digest_len;
  if (!EVP_DigestFinal_ex(ctx.get(), digest, &digest_len)) {
    fprintf(stderr, "Failed to finish hash.\n");
    return false;
  }

  char hex_digest[EVP_MAX_MD_SIZE * 2];
  static const char kHextable[] = "0123456789abcdef";
  for (unsigned i = 0; i < digest_len; i++) {
    const uint8_t b = digest[i];
    hex_digest[i * 2] = kHextable[b >> 4];
    hex_digest[i * 2 + 1] = kHextable[b & 0xf];
  }
  *out_hex = std::string(hex_digest, digest_len * 2);

  return true;
}